

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

MatrixBandPartLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_matrixbandpart(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x523) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x523;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    MatrixBandPartLayerParams::MatrixBandPartLayerParams(this_00.matrixbandpart_);
    (this->layer_).matrixbandpart_ = (MatrixBandPartLayerParams *)this_00;
  }
  return (MatrixBandPartLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::MatrixBandPartLayerParams* NeuralNetworkLayer::mutable_matrixbandpart() {
  if (!has_matrixbandpart()) {
    clear_layer();
    set_has_matrixbandpart();
    layer_.matrixbandpart_ = new ::CoreML::Specification::MatrixBandPartLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.matrixBandPart)
  return layer_.matrixbandpart_;
}